

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void rile_shk(monst *shkp)

{
  long surcharge;
  long lStack_18;
  int ct;
  bill_x *bp;
  monst *shkp_local;
  
  *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xffbfffff;
  if (*(char *)((long)&shkp[0x1b].meating + 2) == '\0') {
    lStack_18._0_2_ = shkp[0x1b].mnum;
    lStack_18._2_1_ = shkp[0x1b].m_lev;
    lStack_18._3_1_ = shkp[0x1b].mx;
    lStack_18._4_1_ = shkp[0x1b].my;
    lStack_18._5_1_ = shkp[0x1b].mux;
    lStack_18._6_1_ = shkp[0x1b].muy;
    lStack_18._7_1_ = shkp[0x1b].malign;
    *(undefined1 *)((long)&shkp[0x1b].meating + 2) = 1;
    surcharge._4_4_ = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2);
    while (0 < surcharge._4_4_) {
      *(int *)(lStack_18 + 8) =
           *(int *)(lStack_18 + 8) + (int)(((long)*(int *)(lStack_18 + 8) + 2) / 3);
      lStack_18 = lStack_18 + 0x10;
      surcharge._4_4_ = surcharge._4_4_ + -1;
    }
  }
  return;
}

Assistant:

static void rile_shk(struct monst *shkp)
{
	NOTANGRY(shkp) = FALSE;	/* make angry */
	if (!ESHK(shkp)->surcharge) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		ESHK(shkp)->surcharge = TRUE;
		while (ct-- > 0) {
			long surcharge = (bp->price + 2L) / 3L;
			bp->price += surcharge;
			bp++;
		}
	}
}